

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

char * __thiscall cmCTestTestHandler::GetTestStatus(cmCTestTestHandler *this,int status)

{
  int status_local;
  cmCTestTestHandler *this_local;
  
  if ((status < 0) || (9 < status)) {
    this_local = (cmCTestTestHandler *)anon_var_dwarf_114138;
  }
  else {
    this_local = (cmCTestTestHandler *)(GetTestStatus::statuses + status);
  }
  return (char *)this_local;
}

Assistant:

const char* cmCTestTestHandler::GetTestStatus(int status)
{
  static const char statuses[][100] = {
    "Not Run",
    "Timeout",
    "SEGFAULT",
    "ILLEGAL",
    "INTERRUPT",
    "NUMERICAL",
    "OTHER_FAULT",
    "Failed",
    "BAD_COMMAND",
    "Completed"
  };

  if ( status < cmCTestTestHandler::NOT_RUN ||
       status > cmCTestTestHandler::COMPLETED )
    {
    return "No Status";
    }
  return statuses[status];
}